

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

bool basist::compute_least_squares_endpoints_rgb
               (color32 *pColors,uint8_t *pSelectors,vec3F *pXl,vec3F *pXh)

{
  byte bVar1;
  uint32_t c;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t lo_v;
  uint uVar6;
  uint32_t i_1;
  uint uVar7;
  long lVar8;
  uint32_t hi_v;
  uint uVar9;
  uint uVar10;
  uint32_t i;
  uint uVar11;
  long lVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  uVar4 = 0;
  uVar10 = 0;
  uVar3 = 0;
  uVar9 = 0;
  uVar7 = 0;
  uVar6 = 0;
  uVar2 = 0;
  for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
    bVar1 = pSelectors[lVar12];
    uVar5 = (uint)pColors[lVar12].field_0.field_0.r;
    uVar6 = uVar6 + uVar5;
    uVar11 = (uint)pColors[lVar12].field_0.field_0.g;
    uVar9 = uVar9 + uVar11;
    uVar13 = (uint)pColors[lVar12].field_0.field_0.b;
    uVar10 = uVar10 + uVar13;
    uVar4 = uVar4 + compute_least_squares_endpoints_rgb::s_weight_vals[bVar1];
    uVar2 = uVar2 + uVar5 * bVar1;
    uVar7 = uVar7 + uVar11 * bVar1;
    uVar3 = bVar1 * uVar13 + uVar3;
  }
  uVar5 = uVar4 >> 0x10 & 0xff;
  uVar11 = uVar4 >> 8 & 0xff;
  fVar21 = (float)(int)(uVar5 * (uVar4 & 0xff) - uVar11 * uVar11);
  fVar14 = ABS(fVar21);
  if (1e-08 <= fVar14) {
    fVar18 = (float)uVar3;
    fVar20 = (float)uVar7;
    fVar17 = (float)uVar10 * 3.0 - fVar18;
    fVar19 = (float)uVar9 * 3.0 - fVar20;
    fVar23 = (float)uVar2;
    fVar22 = (float)uVar6 * 3.0 - fVar23;
    fVar21 = 3.0 / fVar21;
    fVar16 = (float)(uVar4 & 0xff) * fVar21;
    fVar15 = (float)((uint)(float)uVar11 | (uint)DAT_00264580) * fVar21;
    fVar21 = fVar21 * (float)uVar5;
    pXl->c[0] = fVar15 * fVar22 + fVar16 * fVar23;
    pXh->c[0] = fVar22 * fVar21 + fVar23 * fVar15;
    pXl->c[1] = fVar19 * fVar15 + fVar16 * fVar20;
    pXh->c[1] = fVar19 * fVar21 + fVar20 * fVar15;
    pXl->c[2] = fVar17 * fVar15 + fVar16 * fVar18;
    pXh->c[2] = fVar21 * fVar17 + fVar15 * fVar18;
    for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
      if ((pXl->c[lVar12] <= 0.0 && pXl->c[lVar12] != 0.0) || (255.0 < pXh->c[lVar12])) {
        uVar3 = 0xffffffff;
        uVar2 = 0;
        for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
          bVar1 = pColors[lVar8].field_0.field_0.r;
          if (bVar1 <= uVar3) {
            uVar3 = (uint)bVar1;
          }
          if (uVar2 <= bVar1) {
            uVar2 = (uint)bVar1;
          }
        }
        if (uVar3 == uVar2) {
          pXl->c[lVar12] = (float)uVar3;
          pXh->c[lVar12] = (float)uVar3;
        }
      }
      pColors = (color32 *)((long)&pColors->field_0 + 1);
    }
  }
  return 1e-08 <= fVar14;
}

Assistant:

static bool compute_least_squares_endpoints_rgb(const color32* pColors, const uint8_t* pSelectors, vec3F* pXl, vec3F* pXh)
	{
		// Derived from bc7enc16's LS function.
		// Least squares using normal equations: http://www.cs.cornell.edu/~bindel/class/cs3220-s12/notes/lec10.pdf 
		// I did this in matrix form first, expanded out all the ops, then optimized it a bit.
		uint32_t uq00_r = 0, uq10_r = 0, ut_r = 0, uq00_g = 0, uq10_g = 0, ut_g = 0, uq00_b = 0, uq10_b = 0, ut_b = 0;

		// This table is: 9 * (w * w), 9 * ((1.0f - w) * w), 9 * ((1.0f - w) * (1.0f - w))
		// where w is [0,1/3,2/3,1]. 9 is the perfect multiplier.
		static const uint32_t s_weight_vals[4] = { 0x000009, 0x010204, 0x040201, 0x090000 };

		uint32_t weight_accum = 0;
		for (uint32_t i = 0; i < 16; i++)
		{
			const uint32_t r = pColors[i].c[0], g = pColors[i].c[1], b = pColors[i].c[2];
			const uint32_t sel = pSelectors[i];
			ut_r += r;
			ut_g += g;
			ut_b += b;
			weight_accum += s_weight_vals[sel];
			uq00_r += sel * r;
			uq00_g += sel * g;
			uq00_b += sel * b;
		}

		float q00_r = (float)uq00_r, q10_r = (float)uq10_r, t_r = (float)ut_r;
		float q00_g = (float)uq00_g, q10_g = (float)uq10_g, t_g = (float)ut_g;
		float q00_b = (float)uq00_b, q10_b = (float)uq10_b, t_b = (float)ut_b;

		q10_r = t_r * 3.0f - q00_r;
		q10_g = t_g * 3.0f - q00_g;
		q10_b = t_b * 3.0f - q00_b;

		float z00 = (float)((weight_accum >> 16) & 0xFF);
		float z10 = (float)((weight_accum >> 8) & 0xFF);
		float z11 = (float)(weight_accum & 0xFF);
		float z01 = z10;

		float det = z00 * z11 - z01 * z10;
		if (fabs(det) < 1e-8f)
			return false;

		det = 3.0f / det;

		float iz00, iz01, iz10, iz11;
		iz00 = z11 * det;
		iz01 = -z01 * det;
		iz10 = -z10 * det;
		iz11 = z00 * det;

		pXl->c[0] = iz00 * q00_r + iz01 * q10_r; pXh->c[0] = iz10 * q00_r + iz11 * q10_r;
		pXl->c[1] = iz00 * q00_g + iz01 * q10_g; pXh->c[1] = iz10 * q00_g + iz11 * q10_g;
		pXl->c[2] = iz00 * q00_b + iz01 * q10_b; pXh->c[2] = iz10 * q00_b + iz11 * q10_b;

		// Check and fix channel singularities - might not be needed, but is in UASTC's encoder.
		for (uint32_t c = 0; c < 3; c++)
		{
			if ((pXl->c[c] < 0.0f) || (pXh->c[c] > 255.0f))
			{
				uint32_t lo_v = UINT32_MAX, hi_v = 0;
				for (uint32_t i = 0; i < 16; i++)
				{
					lo_v = basisu::minimumu(lo_v, pColors[i].c[c]);
					hi_v = basisu::maximumu(hi_v, pColors[i].c[c]);
				}

				if (lo_v == hi_v)
				{
					pXl->c[c] = (float)lo_v;
					pXh->c[c] = (float)hi_v;
				}
			}
		}

		return true;
	}